

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O0

void __thiscall
OpenMesh::BaseKernel::copy_all_properties
          (BaseKernel *this,FaceHandle _fh_from,FaceHandle _fh_to,bool _copyBuildIn)

{
  BaseProperty *pBVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference ppBVar5;
  string *psVar6;
  bool local_72;
  bool local_71;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  local_30;
  __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
  local_28;
  iterator p_it;
  bool _copyBuildIn_local;
  BaseKernel *this_local;
  FaceHandle _fh_to_local;
  FaceHandle _fh_from_local;
  
  p_it._M_current._7_1_ = _copyBuildIn;
  this_local._0_4_ = _fh_to.super_BaseHandle.idx_;
  this_local._4_4_ = _fh_from.super_BaseHandle.idx_;
  local_28._M_current = (BaseProperty **)PropertyContainer::begin(&this->fprops_);
  while( true ) {
    local_30._M_current = (BaseProperty **)PropertyContainer::end(&this->fprops_);
    bVar2 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar2) break;
    ppBVar5 = __gnu_cxx::
              __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
              ::operator*(&local_28);
    bVar2 = false;
    local_71 = false;
    if (*ppBVar5 != (BaseProperty *)0x0) {
      bVar2 = (p_it._M_current._7_1_ & 1) == 0;
      local_72 = true;
      if (bVar2) {
        ppBVar5 = __gnu_cxx::
                  __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                  ::operator*(&local_28);
        psVar6 = BaseProperty::name_abi_cxx11_(*ppBVar5);
        std::__cxx11::string::substr((ulong)local_50,(ulong)psVar6);
        local_72 = std::operator!=(local_50,"f:");
      }
      local_71 = local_72;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)local_50);
    }
    if (local_71 != false) {
      ppBVar5 = __gnu_cxx::
                __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
                ::operator*(&local_28);
      pBVar1 = *ppBVar5;
      iVar3 = BaseHandle::idx((BaseHandle *)((long)&this_local + 4));
      iVar4 = BaseHandle::idx((BaseHandle *)&this_local);
      (*pBVar1->_vptr_BaseProperty[7])(pBVar1,(long)iVar3,(long)iVar4);
    }
    __gnu_cxx::
    __normal_iterator<OpenMesh::BaseProperty_**,_std::vector<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>_>
    ::operator++(&local_28);
  }
  return;
}

Assistant:

void copy_all_properties(FaceHandle _fh_from, FaceHandle _fh_to, bool _copyBuildIn = false) {

    for( PropertyContainer::iterator p_it = fprops_.begin();
        p_it != fprops_.end(); ++p_it) {

      // Copy all properties, if build in is true
      // Otherwise, copy only properties without build in specifier
      if ( *p_it && ( _copyBuildIn || (*p_it)->name().substr(0,2) != "f:") )
        (*p_it)->copy(_fh_from.idx(), _fh_to.idx());
    }

  }